

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O0

void NHandyPack::
     TVectorSerializer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
     ::Load(istream *in,
           basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *object)

{
  wchar_t local_2c;
  ulong uStack_28;
  wchar_t obj;
  size_t i;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbStack_18;
  uint32_t size;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *object_local;
  istream *in_local;
  
  pbStack_18 = object;
  object_local = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)in;
  std::istream::read((char *)in,(long)&i + 4);
  std::__cxx11::wstring::clear();
  std::__cxx11::wstring::reserve((ulong)pbStack_18);
  for (uStack_28 = 0; uStack_28 < i._4_4_; uStack_28 = uStack_28 + 1) {
    Load<wchar_t>((istream *)object_local,&local_2c);
    std::__cxx11::wstring::push_back((wchar_t)pbStack_18);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        object.reserve(size);
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.push_back(std::move(obj));
        }
    }